

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O0

void __thiscall streams_tests::xor_file::test_method(xor_file *this)

{
  long lVar1;
  Span<const_std::byte> s;
  Span<const_std::byte> s_00;
  Span<const_std::byte> s_01;
  Span<const_std::byte> s_02;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<std::byte> __l_01;
  Span<const_unsigned_char> s_03;
  Span<const_unsigned_char> s_04;
  Span<const_unsigned_char> s_05;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffee58;
  char *in_stack_ffffffffffffee60;
  char *in_stack_ffffffffffffee68;
  path *in_stack_ffffffffffffee70;
  undefined6 in_stack_ffffffffffffee78;
  undefined1 in_stack_ffffffffffffee7e;
  undefined1 in_stack_ffffffffffffee7f;
  const_string *in_stack_ffffffffffffee80;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffee88;
  const_string *in_stack_ffffffffffffee90;
  FILE *in_stack_ffffffffffffee98;
  undefined7 in_stack_ffffffffffffeea0;
  undefined1 in_stack_ffffffffffffeea7;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffeea8;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffeeb0;
  undefined1 in_stack_ffffffffffffeee0 [15];
  undefined1 in_stack_ffffffffffffeeef;
  failure *ex_6;
  failure *ex_5;
  failure *ex_4;
  failure *ex_3;
  failure *ex_2;
  failure *ex_1;
  failure *ex;
  xor_file *this_local;
  const_string local_d80;
  lazy_ostream local_d70 [2];
  assertion_result local_d50 [2];
  undefined1 local_d11;
  const_string local_c80;
  lazy_ostream local_c70 [2];
  assertion_result local_c50 [5];
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [64];
  vector<std::byte,_std::allocator<std::byte>_> read2_1;
  const_string local_ae8;
  lazy_ostream local_ad8 [2];
  assertion_result local_ab8 [2];
  undefined1 local_a79;
  undefined1 local_a38 [16];
  undefined1 local_a28 [96];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [64];
  vector<std::byte,_std::allocator<std::byte>_> read2;
  vector<std::byte,_std::allocator<std::byte>_> read1;
  const_string local_8c0;
  lazy_ostream local_8b0 [2];
  assertion_result local_890 [4];
  undefined1 local_828 [16];
  undefined1 local_818 [88];
  vector<std::byte,_std::allocator<std::byte>_> raw;
  char *mode;
  const_string local_6f8;
  lazy_ostream local_6e8 [2];
  assertion_result local_6c8 [8];
  const_string local_600;
  lazy_ostream local_5f0 [2];
  assertion_result local_5d0 [2];
  undefined1 local_591;
  const_string local_500;
  lazy_ostream local_4f0 [2];
  assertion_result local_4d0 [2];
  undefined1 local_491;
  vector<std::byte,_std::allocator<std::byte>_> xor_pat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test1;
  anon_class_8_1_51447307 raw_file;
  AutoFile xor_file_3;
  AutoFile xor_file_2;
  AutoFile non_xor_file;
  AutoFile xor_file_1;
  AutoFile xor_file;
  undefined1 local_278 [160];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [392];
  path xor_path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((ArgsManager *)in_stack_ffffffffffffee60);
  fs::operator/(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
  fs::path::~path((path *)in_stack_ffffffffffffee58);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffee58);
  __l._M_array._7_1_ = in_stack_ffffffffffffeea7;
  __l._M_array._0_7_ = in_stack_ffffffffffffeea0;
  __l._M_len = (size_type)in_stack_ffffffffffffeea8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee98,__l,
             (allocator_type *)in_stack_ffffffffffffee90);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffee58);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffee58);
  __l_00._M_array._7_1_ = in_stack_ffffffffffffeea7;
  __l_00._M_array._0_7_ = in_stack_ffffffffffffeea0;
  __l_00._M_len = (size_type)in_stack_ffffffffffffeea8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee98,
             __l_00,(allocator_type *)in_stack_ffffffffffffee90);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffee58);
  std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_ffffffffffffee58);
  __l_01._M_array._7_1_ = in_stack_ffffffffffffeea7;
  __l_01._M_array._0_7_ = in_stack_ffffffffffffeea0;
  __l_01._M_len = (size_type)in_stack_ffffffffffffeea8;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee98,__l_01,
             (allocator_type *)in_stack_ffffffffffffee90);
  std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_ffffffffffffee58);
  test_method()::$_0::operator()
            ((anon_class_8_1_51447307 *)in_stack_ffffffffffffee68,
             (char (*) [3])in_stack_ffffffffffffee60);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0),
                     in_stack_ffffffffffffee98,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee90);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_491 = 0;
    AutoFile::operator<<((AutoFile *)in_stack_ffffffffffffee68,(byte *)in_stack_ffffffffffffee60);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                 (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffee68,
                 SUB81((ulong)in_stack_ffffffffffffee60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [57])in_stack_ffffffffffffee58)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      in_stack_ffffffffffffee58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_4d0,local_4f0,&local_500,0x1b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffee58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_591 = 0;
    AutoFile::operator>>((AutoFile *)in_stack_ffffffffffffee68,(byte *)in_stack_ffffffffffffee60);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                 (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffee68,
                 SUB81((ulong)in_stack_ffffffffffffee60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [57])in_stack_ffffffffffffee58)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      in_stack_ffffffffffffee58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_5d0,local_5f0,&local_600,0x1c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffee58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    AutoFile::ignore(&xor_file,1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                 (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffee68,
                 SUB81((ulong)in_stack_ffffffffffffee60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [57])in_stack_ffffffffffffee58)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      in_stack_ffffffffffffee58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_6c8,local_6e8,&local_6f8,0x1d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffee58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  AutoFile::~AutoFile((AutoFile *)in_stack_ffffffffffffee58);
  test_method()::$_0::operator()
            ((anon_class_8_1_51447307 *)in_stack_ffffffffffffee68,(char **)in_stack_ffffffffffffee60
            );
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0),
                     in_stack_ffffffffffffee98,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee90);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  AutoFile::operator<<
            ((AutoFile *)in_stack_ffffffffffffee68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee60);
  AutoFile::operator<<
            ((AutoFile *)in_stack_ffffffffffffee68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee60);
  AutoFile::~AutoFile((AutoFile *)in_stack_ffffffffffffee58);
  test_method()::$_0::operator()
            ((anon_class_8_1_51447307 *)in_stack_ffffffffffffee68,
             (char (*) [3])in_stack_ffffffffffffee60);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee58);
  AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0),
                     in_stack_ffffffffffffee98,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee90);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_ffffffffffffee58);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_stack_ffffffffffffee88,(size_type)in_stack_ffffffffffffee80,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffee7f,
                      CONCAT16(in_stack_ffffffffffffee7e,in_stack_ffffffffffffee78)));
  std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_ffffffffffffee58);
  Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<std::byte> *)in_stack_ffffffffffffee68,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58);
  AutoFile::operator>>
            ((AutoFile *)in_stack_ffffffffffffee68,(Span<std::byte> *)in_stack_ffffffffffffee60);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [1])in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_ffffffffffffee68,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58);
    s.m_size = (size_t)in_stack_ffffffffffffee88;
    s.m_data = (byte *)in_stack_ffffffffffffee80;
    HexStr_abi_cxx11_(s);
    in_stack_ffffffffffffee68 = "\"fc01fd03fd04fa\"";
    in_stack_ffffffffffffee60 = "fc01fd03fd04fa";
    in_stack_ffffffffffffee58 = "HexStr(raw)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
              (local_818,local_828,0x2e,1,2,local_1b8 + 0x80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    AutoFile::ignore(&non_xor_file,1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                 (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffee68,
                 SUB81((ulong)in_stack_ffffffffffffee60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [57])in_stack_ffffffffffffee58)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      in_stack_ffffffffffffee58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_890,local_8b0,&local_8c0,0x30,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffee58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  AutoFile::~AutoFile((AutoFile *)in_stack_ffffffffffffee58);
  test_method()::$_0::operator()
            ((anon_class_8_1_51447307 *)in_stack_ffffffffffffee68,
             (char (*) [3])in_stack_ffffffffffffee60);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0),
                     in_stack_ffffffffffffee98,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee90);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee58);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee58);
  AutoFile::operator>>
            ((AutoFile *)in_stack_ffffffffffffee68,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60);
  AutoFile::operator>>
            ((AutoFile *)in_stack_ffffffffffffee68,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [1])in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_ffffffffffffee68,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58);
    s_00.m_size = (size_t)in_stack_ffffffffffffee88;
    s_00.m_data = (byte *)in_stack_ffffffffffffee80;
    HexStr_abi_cxx11_(s_00);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffee68,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58);
    s_03.m_size._7_1_ = in_stack_ffffffffffffeeef;
    s_03._0_15_ = in_stack_ffffffffffffeee0;
    HexStr_abi_cxx11_(s_03);
    in_stack_ffffffffffffee68 = "HexStr(test1)";
    in_stack_ffffffffffffee60 = local_1b8;
    in_stack_ffffffffffffee58 = "HexStr(read1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_9b8,local_9c8,0x36,1,2,local_1b8 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [1])in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_ffffffffffffee68,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58);
    s_01.m_size = (size_t)in_stack_ffffffffffffee88;
    s_01.m_data = (byte *)in_stack_ffffffffffffee80;
    HexStr_abi_cxx11_(s_01);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffee68,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58);
    s_04.m_size._7_1_ = in_stack_ffffffffffffeeef;
    s_04._0_15_ = in_stack_ffffffffffffeee0;
    HexStr_abi_cxx11_(s_04);
    in_stack_ffffffffffffee68 = "HexStr(test2)";
    in_stack_ffffffffffffee60 = local_278 + 0x80;
    in_stack_ffffffffffffee58 = "HexStr(read2)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_a28,local_a38,0x37,1,2,local_1d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_a79 = 0;
    AutoFile::operator>>((AutoFile *)in_stack_ffffffffffffee68,(byte *)in_stack_ffffffffffffee60);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                 (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffee68,
                 SUB81((ulong)in_stack_ffffffffffffee60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [57])in_stack_ffffffffffffee58)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      in_stack_ffffffffffffee58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_ab8,local_ad8,&local_ae8,0x39,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffee58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  AutoFile::~AutoFile((AutoFile *)in_stack_ffffffffffffee58);
  test_method()::$_0::operator()
            ((anon_class_8_1_51447307 *)in_stack_ffffffffffffee68,
             (char (*) [3])in_stack_ffffffffffffee60);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0),
                     in_stack_ffffffffffffee98,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee90);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee58);
  AutoFile::ignore(&xor_file_3,4);
  AutoFile::operator>>
            ((AutoFile *)in_stack_ffffffffffffee68,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [1])in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_ffffffffffffee68,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58);
    s_02.m_size = (size_t)in_stack_ffffffffffffee88;
    s_02.m_data = (byte *)in_stack_ffffffffffffee80;
    HexStr_abi_cxx11_(s_02);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffee68,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58);
    s_05.m_size._7_1_ = in_stack_ffffffffffffeeef;
    s_05._0_15_ = in_stack_ffffffffffffeee0;
    HexStr_abi_cxx11_(s_05);
    in_stack_ffffffffffffee68 = "HexStr(test2)";
    in_stack_ffffffffffffee60 = local_278;
    in_stack_ffffffffffffee58 = "HexStr(read2)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_bc8,local_bd8,0x41,1,2,local_278 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    AutoFile::ignore(&xor_file_3,1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                 (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffee68,
                 SUB81((ulong)in_stack_ffffffffffffee60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [57])in_stack_ffffffffffffee58)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      in_stack_ffffffffffffee58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_c50,local_c70,&local_c80,0x43,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffee58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
               (unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_d11 = 0;
    AutoFile::operator>>((AutoFile *)in_stack_ffffffffffffee68,(byte *)in_stack_ffffffffffffee60);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                 (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffee68,
                 SUB81((ulong)in_stack_ffffffffffffee60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffee60,(char (*) [57])in_stack_ffffffffffffee58)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (unsigned_long)in_stack_ffffffffffffee58);
      in_stack_ffffffffffffee58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_d50,local_d70,&local_d80,0x44,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffee58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  AutoFile::~AutoFile((AutoFile *)in_stack_ffffffffffffee58);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffee68);
  fs::path::~path((path *)in_stack_ffffffffffffee58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(xor_file)
{
    fs::path xor_path{m_args.GetDataDirBase() / "test_xor.bin"};
    auto raw_file{[&](const auto& mode) { return fsbridge::fopen(xor_path, mode); }};
    const std::vector<uint8_t> test1{1, 2, 3};
    const std::vector<uint8_t> test2{4, 5};
    const std::vector<std::byte> xor_pat{std::byte{0xff}, std::byte{0x00}};
    {
        // Check errors for missing file
        AutoFile xor_file{raw_file("rb"), xor_pat};
        BOOST_CHECK_EXCEPTION(xor_file << std::byte{}, std::ios_base::failure, HasReason{"AutoFile::write: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: file handle is nullpt"});
    }
    {
#ifdef __MINGW64__
        // Temporary workaround for https://github.com/bitcoin/bitcoin/issues/30210
        const char* mode = "wb";
#else
        const char* mode = "wbx";
#endif
        AutoFile xor_file{raw_file(mode), xor_pat};
        xor_file << test1 << test2;
    }
    {
        // Read raw from disk
        AutoFile non_xor_file{raw_file("rb")};
        std::vector<std::byte> raw(7);
        non_xor_file >> Span{raw};
        BOOST_CHECK_EQUAL(HexStr(raw), "fc01fd03fd04fa");
        // Check that no padding exists
        BOOST_CHECK_EXCEPTION(non_xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read1, read2;
        xor_file >> read1 >> read2;
        BOOST_CHECK_EQUAL(HexStr(read1), HexStr(test1));
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that eof was reached
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read2;
        // Check that ignore works
        xor_file.ignore(4);
        xor_file >> read2;
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that ignore and read fail now
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
}